

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ParamsNode * __thiscall Parser::function_params(Parser *this)

{
  Token *pTVar1;
  pointer *pppPVar2;
  int iVar3;
  pointer pTVar4;
  pointer puVar5;
  bool bVar6;
  ParamsNode *pPVar7;
  ulong uVar8;
  ParamNode *pPVar9;
  pointer pTVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  iterator iVar14;
  TokenKind TVar15;
  ParamsNode *pPVar16;
  ParamsNode *local_58;
  ParamNode *local_50 [2];
  long local_40;
  
  pPVar7 = (ParamsNode *)operator_new(0x28);
  (pPVar7->super_Node).kind = ParamsNode;
  (pPVar7->super_Node)._vptr_Node = (_func_int **)&PTR__ParamsNode_00117bc8;
  (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expect(this,'(');
  pTVar1 = &this->eof;
LAB_0010ef0e:
  do {
    iVar3 = this->tok_i;
    uVar11 = iVar3 + 1;
    this->tok_i = uVar11;
    if (iVar3 < -1) {
LAB_0010ef4a:
      this->tok = pTVar1;
    }
    else {
      uVar8 = (ulong)uVar11;
      pTVar10 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar13 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 2) *
               -0x3333333333333333;
      if (uVar13 < uVar8 || uVar13 - uVar8 == 0) goto LAB_0010ef4a;
      this->tok = pTVar10 + uVar8;
    }
    TVar15 = this->tok->kind;
    if (TVar15 == Punctuator) {
      if (this->tok->i == 0x29) {
        pPVar16 = (ParamsNode *)0x0;
        local_58 = pPVar7;
        goto LAB_0010f20a;
      }
    }
    else if (TVar15 == Eof) {
      local_58 = (ParamsNode *)0x0;
      pPVar16 = pPVar7;
      goto LAB_0010f20a;
    }
    bVar6 = is_builtin_type(this);
    if (!bVar6) {
      error<char_const(&)[22]>(this,(char (*) [22])"expecting \')\' or type");
      goto LAB_0010ef0e;
    }
    pPVar9 = (ParamNode *)operator_new(0x30);
    (pPVar9->super_Node).kind = ParamNode;
    (pPVar9->super_Node)._vptr_Node = (_func_int **)&PTR__ParamNode_00117c00;
    (pPVar9->name)._M_dataplus._M_p = (pointer)&(pPVar9->name).field_2;
    (pPVar9->name)._M_string_length = 0;
    (pPVar9->name).field_2._M_local_buf[0] = '\0';
    *(int *)&(pPVar9->super_Node).field_0xc = this->tok->i;
    iVar3 = this->tok_i;
    uVar11 = iVar3 + 1;
    this->tok_i = uVar11;
    pTVar10 = pTVar1;
    if (-2 < iVar3) {
      uVar8 = (ulong)uVar11;
      pTVar10 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar13 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 2) *
               -0x3333333333333333;
      pTVar10 = pTVar10 + uVar8;
      if (uVar13 < uVar8 || uVar13 - uVar8 == 0) {
        pTVar10 = pTVar1;
      }
    }
    TVar15 = pTVar10->kind;
    bVar6 = TVar15 == Punctuator;
    if ((bVar6) && (pTVar10->i == 0x2a)) {
      uVar11 = this->tok_i;
      do {
        uVar12 = uVar11 + 1;
        pTVar10 = pTVar1;
        if (-2 < (int)uVar11) {
          uVar8 = (ulong)uVar12;
          pTVar4 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar13 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 2) *
                   -0x3333333333333333;
          if (uVar8 <= uVar13 && uVar13 - uVar8 != 0) {
            pTVar10 = pTVar4 + uVar8;
          }
        }
        TVar15 = pTVar10->kind;
        bVar6 = TVar15 == Punctuator;
      } while ((bVar6) && (uVar11 = uVar12, pTVar10->i == 0x2a));
      this->tok_i = uVar12;
    }
    this->tok = pTVar10;
    if (TVar15 == Identifier) {
      puVar5 = (this->lex_data->ids).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_50[0] = (ParamNode *)&local_40;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((string *)local_50,puVar5 + pTVar10->i,puVar5 + pTVar10->j);
      std::__cxx11::string::operator=((string *)&pPVar9->name,(string *)local_50);
      if (local_50[0] != (ParamNode *)&local_40) {
        operator_delete(local_50[0],local_40 + 1);
      }
      iVar3 = this->tok_i;
      uVar11 = iVar3 + 1;
      this->tok_i = uVar11;
      pTVar10 = pTVar1;
      if (-2 < iVar3) {
        uVar8 = (ulong)uVar11;
        pTVar10 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl
                  .super__Vector_impl_data._M_start;
        uVar13 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 2) *
                 -0x3333333333333333;
        pTVar10 = pTVar10 + uVar8;
        if (uVar13 < uVar8 || uVar13 - uVar8 == 0) {
          pTVar10 = pTVar1;
        }
      }
      this->tok = pTVar10;
      if (pTVar10->kind != Punctuator) {
LAB_0010f18f:
        error<char_const(&)[38]>(this,(char (*) [38])"expecting \',\' or \')\' after param name");
        goto LAB_0010f19e;
      }
      if (pTVar10->i != 0x29) {
        if (pTVar10->i == 0x2c) goto LAB_0010f19e;
        goto LAB_0010f18f;
      }
      iVar14._M_current =
           (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_50[0] = pPVar9;
        std::vector<ParamNode*,std::allocator<ParamNode*>>::_M_realloc_insert<ParamNode*>
                  ((vector<ParamNode*,std::allocator<ParamNode*>> *)&pPVar7->params,iVar14,local_50)
        ;
      }
      else {
LAB_0010f15e:
        *iVar14._M_current = pPVar9;
        pppPVar2 = &(pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppPVar2 = *pppPVar2 + 1;
        local_50[0] = pPVar9;
      }
LAB_0010f1df:
      bVar6 = false;
      local_58 = pPVar7;
      pPVar7 = (ParamsNode *)0x0;
    }
    else {
      if (bVar6) {
        if (pTVar10->i == 0x29) {
          iVar14._M_current =
               (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar14._M_current !=
              (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) goto LAB_0010f15e;
          local_50[0] = pPVar9;
          std::vector<ParamNode*,std::allocator<ParamNode*>>::_M_realloc_insert<ParamNode*>
                    ((vector<ParamNode*,std::allocator<ParamNode*>> *)&pPVar7->params,iVar14,
                     local_50);
          goto LAB_0010f1df;
        }
        if ((bVar6) && (pTVar10->i == 0x2c)) goto LAB_0010f19e;
      }
      error<char_const(&)[51]>
                (this,(char (*) [51])"expecting \',\', \')\', or param name after param type");
LAB_0010f19e:
      iVar14._M_current =
           (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_50[0] = pPVar9;
        std::vector<ParamNode*,std::allocator<ParamNode*>>::_M_realloc_insert<ParamNode*>
                  ((vector<ParamNode*,std::allocator<ParamNode*>> *)&pPVar7->params,iVar14,local_50)
        ;
      }
      else {
        *iVar14._M_current = pPVar9;
        pppPVar2 = &(pPVar7->params).super__Vector_base<ParamNode_*,_std::allocator<ParamNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppPVar2 = *pppPVar2 + 1;
        local_50[0] = pPVar9;
      }
      bVar6 = true;
    }
    pPVar16 = pPVar7;
    if (!bVar6) {
LAB_0010f20a:
      if (pPVar16 != (ParamsNode *)0x0) {
        (*(pPVar16->super_Node)._vptr_Node[1])();
      }
      return local_58;
    }
  } while( true );
}

Assistant:

ParamsNode* Parser::function_params()
{
  auto ps = std::make_unique<ParamsNode>();

  expect('(');
  while (next_token().kind != TokenKind::Eof) {
    if (is_punctuator(')')) {
      return ps.release();
    }
    else if (is_builtin_type()) {
      auto p = std::make_unique<ParamNode>();
      p->builtin_type = (Keyword)tok->i;

      next_token();

      // Pointers
      while (is_punctuator('*')) // TODO add this info to param type
        next_token();

      if (is(TokenKind::Identifier)) { // Param with name
        p->name = lex_data->id_text(*tok);

        next_token();
        if (is_punctuator(')')) {
          ps->params.push_back(p.get());
          p.release();
          return ps.release();
        }
        else if (!is_punctuator(','))
          error("expecting ',' or ')' after param name");
      }
      // Param without name
      else if (is_punctuator(')')) {
        ps->params.push_back(p.get());
        p.release();
        return ps.release();
      }
      else if (!is_punctuator(','))
        error("expecting ',', ')', or param name after param type");

      ps->params.push_back(p.get());
      p.release();
    }
    else {
      error("expecting ')' or type");
    }
  }

  return nullptr;
}